

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2sf2rom.cpp
# Opt level: O0

void load_2sf(string *filename,vector<char,_std::allocator<char>_> *rom,int lib_nest_level,
             bool first_load)

{
  __node_base_ptr *__dest;
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ostream *poVar7;
  out_of_range *poVar8;
  char *pcVar9;
  undefined8 uVar10;
  runtime_error *prVar11;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar12;
  size_type sVar13;
  mapped_type *filename_00;
  void *buf;
  size_t size;
  size_type __nbytes;
  reference pvVar14;
  ssize_t sVar15;
  string local_3e98 [32];
  ostringstream local_3e78 [8];
  ostringstream message_buffer_6;
  string local_3cf8 [32];
  ostringstream local_3cd8 [8];
  ostringstream message_buffer_5;
  value_type_conflict local_3b5a [2];
  string local_3b58 [32];
  ostringstream local_3b38 [8];
  ostringstream message_buffer_4;
  string local_39b8 [32];
  ostringstream local_3998 [8];
  ostringstream message_buffer_3;
  uint local_3818;
  uint uStack_3814;
  bool read_success;
  uint32_t load_size;
  uint32_t load_offset;
  ZlibReader compressed_exe;
  exception anon_var_0;
  int local_374c;
  key_type local_3748 [8];
  string lib_tag_name;
  ostringstream local_3728 [8];
  ostringstream lib_tag_name_buffer;
  int local_35b0;
  int lib_index;
  ostringstream local_3588 [8];
  ostringstream message_buffer_2;
  undefined1 local_3408 [4];
  uint32_t actual_crc32;
  PSFFile psf;
  char basedir [4096];
  string local_2370 [32];
  ostringstream local_2350 [8];
  ostringstream message_buffer_1;
  char local_21d8 [8];
  char absolute_path [4096];
  char pwd [4096];
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream message_buffer;
  byte local_1d;
  bool first_load_local;
  int lib_nest_level_local;
  vector<char,_std::allocator<char>_> *rom_local;
  string *filename_local;
  
  if (9 < lib_nest_level) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar7 = std::operator<<((ostream *)local_198,(string *)filename);
    poVar7 = std::operator<<(poVar7,": ");
    std::operator<<(poVar7,"Nest level error on psflib loading.");
    poVar8 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::out_of_range::out_of_range(poVar8,local_1c8);
    __cxa_throw(poVar8,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  getcwd(absolute_path + 0xff8,0x1000);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  pcVar9 = path_getabspath(pcVar9,local_21d8);
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_2350);
    poVar7 = std::operator<<((ostream *)local_2350,(string *)filename);
    poVar7 = std::operator<<(poVar7,": ");
    std::operator<<(poVar7,"Unable to determine absolute path.");
    poVar8 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::out_of_range::out_of_range(poVar8,local_2370);
    __cxa_throw(poVar8,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  __dest = &psf.tags_._M_h._M_single_bucket;
  strcpy((char *)__dest,local_21d8);
  path_dirname((char *)__dest);
  PSFFile::PSFFile((PSFFile *)local_3408,filename);
  PSFFile::compressed_exe_abi_cxx11_((PSFFile *)local_3408);
  uVar10 = std::__cxx11::string::data();
  PSFFile::compressed_exe_abi_cxx11_((PSFFile *)local_3408);
  uVar3 = std::__cxx11::string::size();
  uVar4 = crc32(0,uVar10,uVar3);
  uVar5 = PSFFile::compressed_exe_crc32((PSFFile *)local_3408);
  if (uVar5 != uVar4) {
    std::__cxx11::ostringstream::ostringstream(local_3588);
    poVar7 = std::operator<<((ostream *)local_3588,(string *)filename);
    poVar7 = std::operator<<(poVar7,": ");
    std::operator<<(poVar7,"CRC32 error at the compressed program.");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar11,(string *)&lib_index);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_35b0 = 1;
  local_1d = first_load;
  do {
    std::__cxx11::ostringstream::ostringstream(local_3728);
    std::operator<<((ostream *)local_3728,"_lib");
    if (1 < local_35b0) {
      std::ostream::operator<<((ostream *)local_3728,local_35b0);
    }
    std::__cxx11::ostringstream::str();
    puVar12 = PSFFile::tags_abi_cxx11_((PSFFile *)local_3408);
    sVar13 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::count(puVar12,local_3748);
    if (sVar13 == 0) {
      local_374c = 3;
    }
    else {
      chdir((char *)&psf.tags_._M_h._M_single_bucket);
      puVar12 = PSFFile::tags_abi_cxx11_((PSFFile *)local_3408);
      filename_00 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](puVar12,local_3748);
      load_2sf(filename_00,rom,lib_nest_level + 1,(bool)(local_1d & 1));
      chdir(absolute_path + 0xff8);
      local_1d = 0;
      local_35b0 = local_35b0 + 1;
      local_374c = 0;
    }
    std::__cxx11::string::~string((string *)local_3748);
    std::__cxx11::ostringstream::~ostringstream(local_3728);
  } while (local_374c == 0);
  PSFFile::compressed_exe_abi_cxx11_((PSFFile *)local_3408);
  buf = (void *)std::__cxx11::string::c_str();
  PSFFile::compressed_exe_abi_cxx11_((PSFFile *)local_3408);
  size = std::__cxx11::string::size();
  ZlibReader::ZlibReader((ZlibReader *)&load_size,buf,size);
  bVar1 = ZlibReader::readInt((ZlibReader *)&load_size,&stack0xffffffffffffc7ec);
  bVar2 = ZlibReader::readInt((ZlibReader *)&load_size,&local_3818);
  if (bVar1 && bVar2) {
    if (0x8000000 < uStack_3814 + local_3818) {
      std::__cxx11::ostringstream::ostringstream(local_3b38);
      poVar7 = std::operator<<((ostream *)local_3b38,(string *)filename);
      poVar7 = std::operator<<(poVar7,": ");
      std::operator<<(poVar7,"Load offset/size of 2SF is too large. ");
      local_3b5a[1] = 1;
      poVar8 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::out_of_range::out_of_range(poVar8,local_3b58);
      local_3b5a[1] = 0;
      __cxa_throw(poVar8,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if ((local_1d & 1) == 0) {
      uVar6 = uStack_3814 + local_3818;
      __nbytes = std::vector<char,_std::allocator<char>_>::size(rom);
      if (__nbytes < uVar6) {
        std::__cxx11::ostringstream::ostringstream(local_3cd8);
        poVar7 = std::operator<<((ostream *)local_3cd8,(string *)filename);
        poVar7 = std::operator<<(poVar7,": ");
        std::operator<<(poVar7,"Load offset/size of 2SF is out of bound.");
        poVar8 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::out_of_range::out_of_range(poVar8,local_3cf8);
        __cxa_throw(poVar8,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
    }
    else {
      __nbytes = (size_type)local_3818;
      local_3b5a[0] = '\0';
      std::vector<char,_std::allocator<char>_>::resize
                (rom,(ulong)(uStack_3814 + local_3818),local_3b5a);
    }
    pvVar14 = std::vector<char,_std::allocator<char>_>::operator[](rom,(ulong)uStack_3814);
    sVar15 = ZlibReader::read((ZlibReader *)&load_size,(int)pvVar14,(void *)(ulong)local_3818,
                              __nbytes);
    if ((uint)sVar15 == local_3818) {
      ZlibReader::~ZlibReader((ZlibReader *)&load_size);
      PSFFile::~PSFFile((PSFFile *)local_3408);
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_3e78);
    poVar7 = std::operator<<((ostream *)local_3e78,(string *)filename);
    poVar7 = std::operator<<(poVar7,": ");
    std::operator<<(poVar7,"Failed to deflate data. Program data is corrupted.");
    poVar8 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::out_of_range::out_of_range(poVar8,local_3e98);
    __cxa_throw(poVar8,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::__cxx11::ostringstream::ostringstream(local_3998);
  poVar7 = std::operator<<((ostream *)local_3998,(string *)filename);
  poVar7 = std::operator<<(poVar7,": ");
  std::operator<<(poVar7,"Unable to read the program header.");
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar11,local_39b8);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_2sf(const std::string & filename, std::vector<char> & rom, int lib_nest_level = 0, bool first_load = true) {
  // check the psflib nest level
  if (lib_nest_level >= kPSFLibMaxNestLevel) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Nest level error on psflib loading.";
    throw std::out_of_range(message_buffer.str());
  }

  // save the current directory
  char pwd[PATH_MAX];
  getcwd(pwd, PATH_MAX);

  // get the absolute path
  char absolute_path[PATH_MAX];
  if (path_getabspath(filename.c_str(), absolute_path) == NULL) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to determine absolute path.";
    throw std::out_of_range(message_buffer.str());
  }

  // get the directory path
  char basedir[PATH_MAX];
  strcpy(basedir, absolute_path);
  path_dirname(basedir);

  // load the psf file
  PSFFile psf(filename);

  // check CRC32 of the compressed program
  uint32_t actual_crc32 = ::crc32(0L, reinterpret_cast<const Bytef *>(
    psf.compressed_exe().data()), static_cast<uInt>(psf.compressed_exe().size()));
  if (psf.compressed_exe_crc32() != actual_crc32) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "CRC32 error at the compressed program.";
    throw std::runtime_error(message_buffer.str());
  }

  // load psflibs
  int lib_index = 1;
  while (true) {
    // search for _libN tag
    std::ostringstream lib_tag_name_buffer;
    lib_tag_name_buffer << "_lib";
    if (lib_index > 1) {
      lib_tag_name_buffer << lib_index;
    }
    std::string lib_tag_name = lib_tag_name_buffer.str();

    // if no tag is present, end the lib loading
    if (psf.tags().count(lib_tag_name) == 0) {
      break;
    }

    // set the current directory to the parent psf directory
    chdir(basedir);

    // load the lib
    try {
      load_2sf(psf.tags()[lib_tag_name], rom, lib_nest_level + 1, first_load);
    }
    catch (std::exception) {
      chdir(pwd);
      throw;
    }
    chdir(pwd);
    first_load = false;

    // check the next lib
    lib_index++;
  }

  // read the exe header
  // - 4 bytes offset
  // - 4 bytes size
  ZlibReader compressed_exe(psf.compressed_exe().c_str(), psf.compressed_exe().size());
  uint32_t load_offset;
  uint32_t load_size;
  bool read_success = true;
  read_success &= compressed_exe.readInt(load_offset);
  read_success &= compressed_exe.readInt(load_size);
  if (!read_success) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Unable to read the program header.";
    throw std::runtime_error(message_buffer.str());
  }

  // ensure the rom buffer size
  if (load_offset + load_size > kNDSRomMaxSize) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Load offset/size of 2SF is too large. ";
    throw std::out_of_range(message_buffer.str());
  }
  if (first_load) {
    rom.resize(load_offset + load_size, 0);
  }
  else {
    if (load_offset + load_size > rom.size()) {
      std::ostringstream message_buffer;
      message_buffer << filename << ": " << "Load offset/size of 2SF is out of bound.";
      throw std::out_of_range(message_buffer.str());
    }
  }

  // decompress the program area
  if (compressed_exe.read(&rom[load_offset], load_size) != load_size) {
    std::ostringstream message_buffer;
    message_buffer << filename << ": " << "Failed to deflate data. Program data is corrupted.";
    throw std::out_of_range(message_buffer.str());
  }
}